

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double Alg::productLog(double realz,double imagez)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_58;
  
  if (1e-10 <= ABS(imagez) + ABS(realz)) {
    __x = log(realz);
    dVar1 = log(__x * __x + 0.0);
    dVar1 = (dVar1 * 0.5 + __x) - __x;
    dVar2 = atan2(0.0,__x);
    dVar2 = dVar2 + 0.0;
    local_58 = ABS(dVar2) + ABS(dVar1);
    local_88 = 0.0;
    dVar6 = 1.0;
    uStack_80 = __x;
    while( true ) {
      realz = uStack_80;
      if ((dVar6 <= -1.05) || (local_58 <= 1e-10)) break;
      dVar3 = uStack_80 * uStack_80 + local_88 * local_88;
      dVar6 = 1.0;
      dVar7 = uStack_80 / dVar3 + 1.0;
      dVar3 = local_88 / dVar3;
      dVar5 = dVar7 * dVar7 + dVar3 * dVar3;
      auVar4._8_4_ = SUB84(dVar2,0);
      auVar4._0_8_ = dVar1;
      auVar4._12_4_ = (int)((ulong)dVar2 >> 0x20);
      auVar8._0_8_ = dVar7 * dVar2 + SUB168(auVar4 ^ _DAT_00125080,0) * dVar3;
      auVar8._8_8_ = dVar7 * dVar1 + SUB168(auVar4 ^ _DAT_00125080,8) * dVar3;
      auVar9._8_8_ = dVar5;
      auVar9._0_8_ = dVar5;
      auVar9 = divpd(auVar8,auVar9);
      while (-1.0 <= dVar6) {
        dVar3 = local_88 - dVar6 * auVar9._0_8_;
        dVar5 = uStack_80 - dVar6 * auVar9._8_8_;
        dVar1 = log(dVar5 * dVar5 + dVar3 * dVar3);
        dVar1 = (dVar1 * 0.5 + dVar5) - __x;
        dVar2 = atan2(dVar3,dVar5);
        dVar2 = dVar2 + dVar3;
        if (ABS(dVar2) + ABS(dVar1) < local_58) {
          dVar6 = -1.03;
          local_88 = dVar3;
          uStack_80 = dVar5;
          local_58 = ABS(dVar2) + ABS(dVar1);
        }
        else {
          dVar6 = dVar6 + -0.1;
        }
      }
    }
  }
  return realz;
}

Assistant:

double Alg::productLog(double realz, double imagez) {
    if (fabs(realz) + fabs(imagez) < 1e-10) {
        return realz;
    }
    double lnx = log(realz);
    double zx = lnx;
    double zy = 0;
    double F[2];
    double Fx[2];
    double Fy[2];
    double temp = 0;
    double x = zx;
    double y = zy;
    double x0 = 0;
    double y0 = 0;
    Fy[0] = log(x * x + y * y) / 2 + x - zx;
    Fy[1] = y - zy + atan2(y, x);
    double error = fabs(Fy[0]) + fabs(Fy[1]);
    int loopn = 1000;
    double w = 1;
    while (loopn > 0 && w > -1.05 && error > 1e-10) {
        w = x * x + y * y;
        F[0] = x / w + 1;
        F[1] = y / w;
        w = F[0] * F[0] + F[1] * F[1];
        Fx[0] = (Fy[0] * F[0] - Fy[1] * F[1]) / w;
        Fx[1] = (Fy[1] * F[0] - Fy[0] * F[1]) / w;
        w = 1;
        while (w >= -1){
            x0 = x - w * Fx[0];
            y0 = y - w * Fx[1];
            Fy[0] = log(x0 * x0 + y0 * y0) / 2 + x0 - zx;
            Fy[1] = y0 - zy + atan2(y0, x0);
            temp = fabs(Fy[0]) + fabs(Fy[1]);
            if (temp < error) {
                error = temp;
                x = x0;
                y = y0;
                w = -1.03;
            }
            else {
                w = w - 0.1;
            }
        }
    }
    return x;
}